

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

void __thiscall APowerInvisibility::InitEffect(APowerInvisibility *this)

{
  TObjPtr<AActor> *obj;
  AActor *pAVar1;
  uint uVar2;
  
  obj = &(this->super_APowerup).super_AInventory.Owner;
  pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar1 != (AActor *)0x0) {
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
    uVar2 = (~(pAVar1->flags).Value | 0xfffbffff) &
            (this->super_APowerup).super_AInventory.super_AActor.flags.Value;
    (this->super_APowerup).super_AInventory.super_AActor.flags.Value = uVar2;
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
    (pAVar1->flags).Value = (pAVar1->flags).Value | uVar2 & 0x40000;
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
    uVar2 = (~(pAVar1->flags3).Value | 0xfffffff7) &
            (this->super_APowerup).super_AInventory.super_AActor.flags3.Value;
    (this->super_APowerup).super_AInventory.super_AActor.flags3.Value = uVar2;
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
    (pAVar1->flags3).Value = (pAVar1->flags3).Value | uVar2 & 8;
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
    uVar2 = (~(pAVar1->flags5).Value | 0xefffffff) &
            (this->super_APowerup).super_AInventory.super_AActor.flags5.Value;
    (this->super_APowerup).super_AInventory.super_AActor.flags5.Value = uVar2;
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
    (pAVar1->flags5).Value = (pAVar1->flags5).Value | uVar2 & 0x10000000;
    (*(this->super_APowerup).super_AInventory.super_AActor.super_DThinker.super_DObject.
      _vptr_DObject[0x27])(this);
    return;
  }
  return;
}

Assistant:

void APowerInvisibility::InitEffect ()
{
	Super::InitEffect();
	// This used to call CommonInit(), which used to contain all the code that's repeated every
	// tic, plus the following code that needs to happen once and only once.
	// The CommonInit() code has been moved to DoEffect(), so this now ends with a call to DoEffect(),
	// and DoEffect() no longer needs to call InitEffect(). CommonInit() has been removed for being redundant.
	if (Owner != NULL)
	{
		flags &= ~(Owner->flags  & INVISIBILITY_FLAGS1);
		Owner->flags  |= flags & INVISIBILITY_FLAGS1;
		flags3 &= ~(Owner->flags3 & INVISIBILITY_FLAGS3);
		Owner->flags3 |= flags3 & INVISIBILITY_FLAGS3;
		flags5 &= ~(Owner->flags5 & INVISIBILITY_FLAGS5);
		Owner->flags5 |= flags5 & INVISIBILITY_FLAGS5;

		DoEffect();
	}
}